

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libskiwi.cpp
# Opt level: O2

argtype skiwi::anon_unknown_1::_convert(external_type t)

{
  argtype aVar1;
  
  aVar1 = T_VOID;
  if (t < (skiwi_void|skiwi_double)) {
    aVar1 = t;
  }
  return aVar1;
}

Assistant:

external_function::argtype _convert(external_type t)
    {
    switch (t)
      {
      case skiwi_bool: return external_function::T_BOOL;
      case skiwi_char_pointer: return external_function::T_CHAR_POINTER;
      case skiwi_double: return external_function::T_DOUBLE;
      case skiwi_int64: return external_function::T_INT64;
      case skiwi_void: return external_function::T_VOID;
      case skiwi_scm: return external_function::T_SCM;
      }
    return external_function::T_VOID;
    }